

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O1

int Io_WriteBenchLut(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  long *plVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  Vec_Int_t *vTruth;
  int *piVar6;
  ProgressBar *p;
  Vec_Ptr_t *pVVar7;
  uint *Sign;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t __size;
  long lVar11;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                  ,0xb3,"int Io_WriteBenchLut(Abc_Ntk_t *, char *)");
  }
  iVar3 = Io_WriteBenchCheckNames(pNtk);
  if (iVar3 == 0) {
    pcVar5 = 
    "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
    ;
    __size = 0x93;
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar5 = pNtk->pName;
      pcVar4 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar5,pcVar4);
      pVVar7 = pNtk->vPis;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar7->pArray[lVar11] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar7->pArray[lVar11] + 0x30) * 8));
          fprintf(__stream,"INPUT(%s)\n",pcVar5);
          lVar11 = lVar11 + 1;
          pVVar7 = pNtk->vPis;
        } while (lVar11 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vPos;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*pVVar7->pArray[lVar11] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar7->pArray[lVar11] + 0x20) * 8));
          fprintf(__stream,"OUTPUT(%s)\n",pcVar5);
          lVar11 = lVar11 + 1;
          pVVar7 = pNtk->vPos;
        } while (lVar11 < pVVar7->nSize);
      }
      pVVar7 = pNtk->vBoxes;
      if (0 < pVVar7->nSize) {
        lVar11 = 0;
        do {
          plVar1 = (long *)pVVar7->pArray[lVar11];
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
            plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[6] * 8);
            pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)plVar2[6] * 8));
            plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8);
            pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)plVar1[4] * 8));
            fprintf(__stream,"%-11s = DFFRSE( %s, gnd, gnd, gnd, gnd )\n",pcVar5,pcVar4);
          }
          lVar11 = lVar11 + 1;
          pVVar7 = pNtk->vBoxes;
        } while (lVar11 < pVVar7->nSize);
      }
      vTruth = (Vec_Int_t *)malloc(0x10);
      vTruth->nCap = 10000;
      vTruth->nSize = 0;
      piVar6 = (int *)malloc(40000);
      vTruth->pArray = piVar6;
      p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      pVVar7 = pNtk->vObjs;
      if (pVVar7->nSize < 1) {
LAB_0033a836:
        Extra_ProgressBarStop(p);
        if (vTruth->pArray != (int *)0x0) {
          free(vTruth->pArray);
          vTruth->pArray = (int *)0x0;
        }
        free(vTruth);
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          puts("Io_WriteBench: EXDC is not written (warning).");
        }
        fclose(__stream);
        return 1;
      }
      lVar11 = 0;
LAB_0033a5a1:
      pNode = (Abc_Obj_t *)pVVar7->pArray[lVar11];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
        }
        if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x104,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        iVar3 = (pNode->vFanins).nSize;
        if (8 < iVar3) {
          __assert_fail("nFanins <= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x106,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        Sign = Hop_ManConvertAigToTruth
                         ((Hop_Man_t *)pNode->pNtk->pManFunc,
                          (Hop_Obj_t *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe),iVar3,
                          vTruth,0);
        if (((ulong)pNode->field_5 & 1) != 0) {
          uVar8 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
          if (iVar3 < 6) {
            uVar8 = 1;
          }
          lVar9 = uVar8 + 1;
          do {
            Sign[lVar9 + -2] = ~Sign[lVar9 + -2];
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        uVar8 = (ulong)(uint)(1 << ((char)iVar3 - 5U & 0x1f));
        uVar10 = uVar8;
        if (iVar3 < 6) {
          uVar8 = 1;
          uVar10 = uVar8;
        }
        do {
          if ((long)uVar8 < 1) {
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray])
            ;
            pcVar4 = "%-11s = gnd\n";
            goto LAB_0033a752;
          }
          lVar9 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (Sign[lVar9] == 0);
LAB_0033a679:
        if (0 < (long)uVar10) goto code_r0x0033a682;
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        pcVar4 = "%-11s = vdd\n";
LAB_0033a752:
        fprintf(__stream,pcVar4,pcVar5);
      }
      goto LAB_0033a766;
    }
    pcVar5 = "Io_WriteBench(): Cannot open the output file.\n";
    __size = 0x2e;
  }
  fwrite(pcVar5,__size,1,_stdout);
  return 0;
code_r0x0033a682:
  lVar9 = uVar10 - 1;
  uVar10 = uVar10 - 1;
  if (Sign[lVar9] != 0xffffffff) goto code_r0x0033a68e;
  goto LAB_0033a679;
code_r0x0033a68e:
  pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  if (iVar3 == 1) {
    iVar3 = Abc_NodeIsBuf(pNode);
    Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
    fprintf(__stream,"%-11s = LUT 0x%d ( %s )\n",pcVar5,(ulong)(2 - (iVar3 == 0)));
  }
  else {
    fprintf(__stream,"%-11s = LUT 0x",pcVar5);
    Extra_PrintHexadecimal((FILE *)__stream,Sign,iVar3);
    fwrite(" (",2,1,__stream);
    if (0 < (pNode->vFanins).nSize) {
      uVar8 = 0;
      do {
        pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar8]]
                            );
        pcVar4 = ",";
        if (iVar3 - 1 == uVar8) {
          pcVar4 = "";
        }
        fprintf(__stream," %s%s",pcVar5,pcVar4);
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)(pNode->vFanins).nSize);
    }
    fwrite(" )\n",3,1,__stream);
  }
LAB_0033a766:
  lVar11 = lVar11 + 1;
  pVVar7 = pNtk->vObjs;
  if (pVVar7->nSize <= lVar11) goto LAB_0033a836;
  goto LAB_0033a5a1;
}

Assistant:

int Io_WriteBenchLut( Abc_Ntk_t * pNtk, char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchLutOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}